

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

void __thiscall Table::printState(Table *this)

{
  char cVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  lVar4 = 0;
  while (lVar4 != 9) {
    std::operator<<((ostream *)&std::cout,"|");
    lVar4 = lVar4 + 3;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      cVar1 = Cell::getNumber(this->table[0] + lVar5);
      poVar2 = std::operator<<((ostream *)&std::cout,cVar1);
      std::operator<<(poVar2,"|");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    this = (Table *)(this->table + 1);
  }
  iVar3 = 6;
  while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
    std::operator<<((ostream *)&std::cout,"-");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Table::printState() {
    for (auto & i : table) {
        std::cout << "|";
        for (auto & j : i) {
            std::cout << j.getNumber() << "|";
        }
        std::cout << std::endl;
    }
    for (int i = 0; i < 2*HEIGHT; i++) {
        std::cout << "-";
    }
    std::cout << std::endl;
}